

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true>::
produce_argument(parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true> *this,
                cstring *token,bool param_3,arguments_store *store)

{
  std_string *s;
  byte in_DL;
  basic_cstring<const_char> *in_RSI;
  long in_RDI;
  arguments_store *in_stack_00000008;
  cstring *in_stack_00000010;
  cstring *in_stack_00000018;
  argument_factory<boost::unit_test::log_level,_true,_false> *in_stack_00000020;
  basic_cstring<const_char> *in_stack_ffffffffffffffc0;
  basic_cstring<const_char> local_30;
  byte local_11;
  
  local_11 = in_DL & 1;
  s = (std_string *)(in_RDI + 0xe8);
  unit_test::basic_cstring<const_char>::basic_cstring(&local_30,in_RSI);
  unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffffc0,s);
  argument_factory<boost::unit_test::log_level,_true,_false>::produce_argument
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

virtual void    produce_argument( cstring token, bool , arguments_store& store ) const
    {
        m_arg_factory.produce_argument( token, this->p_name, store );
    }